

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool IsBIP30Repeat(CBlockIndex *block_index)

{
  uint256 *puVar1;
  long in_FS_OFFSET;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (block_index->nHeight == 0x166e8) {
    puVar1 = block_index->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
LAB_00b076bb:
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    auVar4[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == '!');
    auVar4[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] == 0xd7);
    auVar4[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] == '|');
    auVar4[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] == 0xcb);
    auVar4[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] == 'L');
    auVar4[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] == '\b');
    auVar4[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] == '8');
    auVar4[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] == 'j');
    auVar4[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] == '\x04');
    auVar4[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] == 0xac);
    auVar4[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] == '\x01');
    auVar4[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] == 0x96);
    auVar4[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] == 0xae);
    auVar4[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] == '\x10');
    auVar4[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] == 0xf6);
    auVar4[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] == 0xa1);
    auVar6[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x10] == 0xd2);
    auVar6[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x11] == 0xc2);
    auVar6[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x12] == 0xa3);
    auVar6[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x13] == 'w');
    auVar6[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x14] == 'U');
    auVar6[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x15] == 0x8c);
    auVar6[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x16] == 0xa1);
    auVar6[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x17] == 0x90);
    auVar6[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x18] == 0xf1);
    auVar6[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x19] == 'C');
    auVar6[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1a] == '\a');
    auVar6[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1b] == '\0');
    auVar6[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1c] == '\0');
    auVar6[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1d] == '\0');
    auVar6[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1e] == '\0');
    auVar6[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1f] == '\0');
    auVar6 = auVar6 & auVar4;
    bVar2 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    if (block_index->nHeight == 0x166c2) {
      puVar1 = block_index->phashBlock;
      if (puVar1 == (uint256 *)0x0) goto LAB_00b076bb;
      auVar5[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x10] == '\x03');
      auVar5[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x11] == 0xc5);
      auVar5[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x12] == 'c');
      auVar5[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x13] == 0xc1);
      auVar5[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x14] == 0xff);
      auVar5[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x15] == 'a');
      auVar5[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x16] == 0x81);
      auVar5[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x17] == '9');
      auVar5[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x18] == '\n');
      auVar5[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x19] == 'M');
      auVar5[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1a] == '\n');
      auVar5[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1b] == '\0');
      auVar5[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1c] == '\0');
      auVar5[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1d] == '\0');
      auVar5[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1e] == '\0');
      auVar5[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1f] == '\0');
      auVar3[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == 0xec);
      auVar3[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] == 0xca);
      auVar3[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] == 0xe0);
      auVar3[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] == '\0');
      auVar3[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] == 0xe3);
      auVar3[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] == 200);
      auVar3[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] == 0xe4);
      auVar3[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] == 0xe0);
      auVar3[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] == 0x93);
      auVar3[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] == 0x93);
      auVar3[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] == 'c');
      auVar3[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] == '`');
      auVar3[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] == 'C');
      auVar3[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] == '\x1f');
      auVar3[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] == ';');
      auVar3[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] == 'v');
      auVar5 = auVar5 & auVar3;
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
        bVar2 = true;
        goto LAB_00b0769b;
      }
    }
    bVar2 = false;
  }
LAB_00b0769b:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBIP30Repeat(const CBlockIndex& block_index)
{
    return (block_index.nHeight==91842 && block_index.GetBlockHash() == uint256{"00000000000a4d0a398161ffc163c503763b1f4360639393e0e4c8e300e0caec"}) ||
           (block_index.nHeight==91880 && block_index.GetBlockHash() == uint256{"00000000000743f190a18c5577a3c2d2a1f610ae9601ac046a38084ccb7cd721"});
}